

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

int __thiscall PeleLM::derive(PeleLM *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  int ncomp;
  DeriveRec *this_00;
  MultiFab *this_01;
  undefined4 in_XMM0_Da;
  string msg;
  FabFactory<amrex::FArrayBox> local_60;
  undefined1 local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)0x0;
  this_00 = amrex::DeriveList::get((DeriveList *)amrex::AmrLevel::derive_lst,(string *)key);
  if (this_00 == (DeriveRec *)0x0) {
    amrex::AmrLevel::derive((AmrLevel *)local_58,ctx,key,(size_t *)((ulong)keylen & 0xffffffff));
    (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)local_58._0_8_;
    if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
      std::__cxx11::string::string
                ((string *)local_58,"PeleLM::derive(): unknown variable: ",(allocator *)&local_60);
      std::__cxx11::string::append((string *)local_58);
      amrex::Error_host((char *)local_58._0_8_);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  else {
    this_01 = (MultiFab *)operator_new(0x180);
    ncomp = amrex::DeriveRec::numDerive(this_00);
    local_58._0_8_ = (_func_int **)0x1;
    local_58._8_8_ = (Arena *)0x0;
    vStack_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    amrex::MultiFab::MultiFab
              (this_01,(BoxArray *)(ctx + 0xd8),(DistributionMapping *)(ctx + 0x140),ncomp,
               (int)keylen,(MFInfo *)local_58,&local_60);
    (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)this_01;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_48);
    (**(code **)(*(long *)ctx + 0x100))(in_XMM0_Da,ctx,key,this_01,0);
  }
  return (int)this;
}

Assistant:

std::unique_ptr<MultiFab>
PeleLM::derive (const std::string& name,
                Real               time,
                int                ngrow)
{
  AMREX_ASSERT(ngrow >= 0);

  std::unique_ptr<MultiFab> mf;
  const DeriveRec* rec = derive_lst.get(name);
  if (rec)
  {
    mf.reset(new MultiFab(grids, dmap, rec->numDerive(), ngrow));
    int dcomp = 0;
    derive(name,time,*mf,dcomp);
  }
  else
  {
    mf = std::move(AmrLevel::derive(name,time,ngrow));
  }

  if (mf==nullptr) {
    std::string msg("PeleLM::derive(): unknown variable: ");
    msg += name;
    amrex::Error(msg.c_str());
  }
  return mf;
}